

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

string * __thiscall
TwoStageDynamicBayesianNetwork::SoftPrintSoI_O_abi_cxx11_
          (TwoStageDynamicBayesianNetwork *this,Index agI)

{
  ostream *poVar1;
  const_reference s;
  ostream *poVar2;
  uint in_EDX;
  string *in_RDI;
  stringstream ss;
  size_type in_stack_fffffffffffffdc8;
  vector<Scope,_std::allocator<Scope>_> *in_stack_fffffffffffffdd0;
  stringstream local_1a0 [16];
  ostream local_190 [380];
  uint local_14;
  
  local_14 = in_EDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"agI=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1,", XSoI_O=");
  s = std::vector<Scope,_std::allocator<Scope>_>::at
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  poVar2 = ::operator<<(poVar1,s);
  std::operator<<(poVar2,", ASoI_O=");
  std::vector<Scope,_std::allocator<Scope>_>::at
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  poVar2 = ::operator<<(poVar1,s);
  std::operator<<(poVar2,", YSoI_O=");
  std::vector<Scope,_std::allocator<Scope>_>::at
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  poVar2 = ::operator<<(poVar1,s);
  std::operator<<(poVar2,", OSoI_O=");
  std::vector<Scope,_std::allocator<Scope>_>::at
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  ::operator<<(poVar1,s);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

string TwoStageDynamicBayesianNetwork::SoftPrintSoI_O(Index agI) const
{
    stringstream ss;
    ss << "agI=" << agI <<
        ", XSoI_O=" << _m_XSoI_O.at(agI) << 
        ", ASoI_O=" << _m_ASoI_O.at(agI) << 
        ", YSoI_O=" << _m_YSoI_O.at(agI) << 
        ", OSoI_O=" << _m_OSoI_O.at(agI);
    return(ss.str());
}